

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter-base.hxx
# Opt level: O3

StateVector * __thiscall
stateObservation::compileTime::KalmanFilterBase<4U,_3U,_0U>::oneStepEstimation_
          (StateVector *__return_storage_ptr__,KalmanFilterBase<4U,_3U,_0U> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  _Map_pointer ppIVar8;
  _Map_pointer ppIVar9;
  undefined1 auVar10 [16];
  IndexedMatrix<3U,_1U> *pIVar11;
  char *__function;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  MatrixT *pMVar15;
  MatrixT *pMVar16;
  _Elt_pointer pIVar17;
  MatrixT *pMVar18;
  double *pdVar19;
  RhsNested pMVar20;
  Index outer;
  ActualDstType actualDst;
  byte bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  Cmatrix c;
  MeasureVector ino;
  Pmatrix pbar;
  StateVector xbar;
  DstEvaluatorType dstEvaluator;
  Amatrix a;
  Pmatrix px;
  Rmatrix inoCov;
  assign_op<double,_double> local_445;
  uint local_444;
  StateVector *local_440;
  undefined1 local_438 [16];
  double local_428;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8 [4];
  double dStack_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  double dStack_368;
  double local_360;
  double dStack_358;
  double dStack_350;
  undefined1 local_348 [16];
  double local_338;
  SrcEvaluatorType local_328;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_260;
  undefined1 local_238 [40];
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  Matrix<double,_3,_3,_0,_3,_3> local_1d8;
  RhsNested pMStack_190;
  double local_178 [4];
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8 [16];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_78 [2];
  
  bVar21 = 0;
  if ((this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.isSet_ == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]";
    goto LAB_00115c4c;
  }
  ppIVar8 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
            super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppIVar9 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
            super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pIVar11 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
            super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pIVar11 >> 5) +
      ((long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)ppIVar8 - (long)ppIVar9) >> 3) - 1) + (ulong)(ppIVar8 == (_Map_pointer)0x0))
      * 0x10 == 0) goto LAB_00115b32;
  lVar13 = (long)pIVar11 -
           (long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
                 super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
  uVar12 = lVar13 >> 5;
  if ((long)uVar12 < 0) {
    uVar14 = lVar13 >> 9;
LAB_00114e3c:
    pIVar11 = ppIVar9[uVar14] + uVar12 + uVar14 * -0x10;
  }
  else if (0xf < uVar12) {
    uVar14 = uVar12 >> 4;
    goto LAB_00114e3c;
  }
  if (pIVar11->isSet_ != false) {
    uVar7 = pIVar11->k_;
    if (uVar7 != (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.k_ + 1) {
LAB_00115b32:
      __assert_fail("this->y_.size()> 0 && this->y_[0].getTime()==k+1 && \"ERROR: The measurement vector is not set\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x41,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->a_).isSet_ == false) {
      __assert_fail("a_.isSet() && \"ERROR: The Matrix A is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x45,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->c_).isSet_ == false) {
      __assert_fail("c_.isSet() && \"ERROR: The Matrix C is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x46,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->q_).isSet_ == false) {
      __assert_fail("q_.isSet() && \"ERROR: The Matrix Q is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x47,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->r_).isSet_ == false) {
      __assert_fail("r_.isSet() && \"ERROR: The Matrix R is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x48,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    if ((this->p_).isSet_ == false) {
      __assert_fail("p_.isSet() && \"ERROR: The Matrix P is not initialized\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                    ,0x49,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
                   );
    }
    pMVar16 = &(this->a_).v_;
    pdVar19 = local_178;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      *pdVar19 = (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
      pMVar16 = (MatrixT *)
                ((pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array + 1);
      pdVar19 = pdVar19 + 1;
    }
    pMVar15 = &(this->c_).v_;
    pdVar19 = local_3a8;
    for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
      *pdVar19 = (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
                 m_data.array[0];
      pMVar15 = (MatrixT *)
                ((pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
                 m_data.array + 1);
      pdVar19 = pdVar19 + 1;
    }
    pMVar16 = &(this->p_).v_;
    pdVar19 = local_f8;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      *pdVar19 = (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
      pMVar16 = (MatrixT *)
                ((pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array + 1);
      pdVar19 = pdVar19 + 1;
    }
    (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>._vptr_ObserverBase
      [0x17])(&local_288,this,(ulong)uVar7);
    if ((this->q_).isSet_ == false) {
      __function = 
      "void stateObservation::compileTime::IndexedMatrix<4, 4>::check_() const [r = 4, c = 4]";
      goto LAB_00115c4c;
    }
    local_410 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[0];
    local_408 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[1];
    local_400 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[2];
    local_3f8 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[3];
    local_3f0 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[4];
    local_3e8 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[5];
    local_3e0 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[6];
    local_3d8 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[7];
    local_3d0 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[8];
    local_3c8 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[9];
    local_3c0 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[10];
    local_3b8 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[0xb];
    local_3b0 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[0xc];
    local_440 = (StateVector *)
                (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[0xd];
    local_438._0_8_ =
         (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
         .array[0xe];
    local_428 = (this->q_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                .m_data.array[0xf];
    local_260.m_lhs.m_lhs.m_lhs = (LhsNested)(local_238 + 0x20);
    lVar13 = 0;
    do {
      dVar1 = *(double *)((long)local_f8 + lVar13);
      dVar2 = *(double *)((long)local_f8 + lVar13 + 8);
      dVar22 = *(double *)((long)local_f8 + lVar13 + 0x10);
      dVar23 = *(double *)((long)local_f8 + lVar13 + 0x18);
      *(double *)
       ((long)local_328.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar13) =
           local_118 * dVar23 + local_138 * dVar22 + local_158 * dVar2 + local_178[0] * dVar1;
      *(double *)
       ((long)local_328.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar13 + 8) =
           dStack_110 * dVar23 + dStack_130 * dVar22 + dStack_150 * dVar2 + local_178[1] * dVar1;
      *(double *)
       ((long)local_328.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar13 + 0x10) =
           dVar23 * local_108 + dVar22 * local_128 + dVar2 * local_148 + dVar1 * local_178[2];
      *(double *)
       ((long)local_328.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + lVar13 + 0x18) =
           dVar23 * dStack_100 + dVar22 * dStack_120 + dVar2 * dStack_140 + dVar1 * local_178[3];
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x80);
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 4;
    local_78[0].m_dst = (DstEvaluatorType *)&local_260;
    local_78[0].m_functor = (assign_op<double,_double> *)local_348;
    lVar13 = 0;
    local_444 = uVar7;
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs.m_matrix = (non_const_type)local_178;
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)&local_328;
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::IndexBased,_double>
            )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::IndexBased,_double>
              )local_178;
    local_238._16_8_ = local_260.m_lhs.m_lhs.m_lhs;
    local_78[0].m_src = &local_328;
    local_78[0].m_dstExpr = (DstXprType *)local_260.m_lhs.m_lhs.m_lhs;
    do {
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
      ::run(local_78,lVar13);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         local_410 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[0];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         local_408 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[4];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         local_400 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[8];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         local_3f8 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[0xc];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         local_3f0 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[1];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
         local_3e8 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[5];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         local_3e0 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[9];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
         local_3d8 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[0xd];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
         local_3d0 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[2];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
         local_3c8 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[6];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
         local_3c0 +
         (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage).
         m_data.array[10];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
         = local_3b8 +
           (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage)
           .m_data.array[0xe];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
         = local_3b0 +
           (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage)
           .m_data.array[3];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
         = (double)local_440 +
           (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage)
           .m_data.array[7];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
         = (double)local_438._0_8_ +
           (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage)
           .m_data.array[0xb];
    local_328.
    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
         = local_428 +
           (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_238._16_8_)->m_storage)
           .m_data.array[0xf];
    pIVar17 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
              super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar13 = (long)pIVar17 -
             (long)(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
                   super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
    uVar12 = lVar13 >> 5;
    if ((long)uVar12 < 0) {
      uVar14 = lVar13 >> 9;
LAB_00115319:
      pIVar17 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
                super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar12 + uVar14 * -0x10;
    }
    else if (0xf < uVar12) {
      uVar14 = uVar12 >> 4;
      goto LAB_00115319;
    }
    if (pIVar17->isSet_ != false) {
      local_438 = *(undefined1 (*) [16])
                   (pIVar17->v_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array;
      local_428 = (pIVar17->v_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
      local_440 = __return_storage_ptr__;
      (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>.
        _vptr_ObserverBase[0x18])((RhsNested)local_238,this,&local_288,(ulong)local_444);
      local_338 = local_428 - (double)local_238._16_8_;
      local_348._8_4_ = SUB84((double)local_438._8_8_ - (double)local_238._8_8_,0);
      local_348._0_8_ = (double)local_438._0_8_ - (double)local_238._0_8_;
      local_348._12_4_ = (int)((ulong)((double)local_438._8_8_ - (double)local_238._8_8_) >> 0x20);
      if ((this->r_).isSet_ != false) {
        pMVar18 = &(this->r_).v_;
        pMVar20 = (RhsNested)local_238;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0] = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[0];
          pMVar18 = (MatrixT *)((long)pMVar18 + (ulong)bVar21 * -0x10 + 8);
          pMVar20 = (RhsNested)((long)pMVar20 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        local_260.m_lhs.m_lhs.m_lhs = (LhsNested)local_3a8;
        local_260.m_lhs.m_lhs.m_rhs = (RhsNested)&local_328;
        local_260.m_lhs.m_rhs.m_matrix = (non_const_type)local_3a8;
        local_260.m_rhs = (RhsNested)local_238;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,_3,_3,_0,_3,_3> *)local_78,&local_260,&local_445);
        local_238._0_8_ =
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xc] * local_360 +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[8] * local_378 +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[4] * local_3a8[3] +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0] * local_3a8[0];
        local_238._8_8_ =
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xd] * local_360 +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[9] * local_378 +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[5] * local_3a8[3] +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1] * local_3a8[0];
        local_238._16_8_ =
             local_360 *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xe] +
             local_378 *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[10] +
             local_3a8[3] *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[6] +
             local_3a8[0] *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2];
        local_238._24_8_ =
             local_360 *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xf] +
             local_378 *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xb] +
             local_3a8[3] *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[7] +
             local_3a8[0] *
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[3];
        local_238._32_8_ =
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xc] * dStack_358 +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[8] * dStack_370 +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[4] * dStack_388 +
             local_328.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0] * local_3a8[1];
        dStack_210 = local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xd] * dStack_358 +
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[9] * dStack_370 +
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[5] * dStack_388 +
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1] * local_3a8[1];
        local_208 = dStack_358 *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xe] +
                    dStack_370 *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[10] +
                    dStack_388 *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[6] +
                    local_3a8[1] *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[2];
        dStack_200 = dStack_358 *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xf] +
                     dStack_370 *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xb] +
                     dStack_388 *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[7] +
                     local_3a8[1] *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3];
        local_1f8 = local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xc] * dStack_350 +
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[8] * dStack_368 +
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[4] * dStack_380 +
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0] * local_3a8[2];
        dStack_1f0 = local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xd] * dStack_350 +
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[9] * dStack_368 +
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[5] * dStack_380 +
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[1] * local_3a8[2];
        local_1e8 = dStack_350 *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xe] +
                    dStack_368 *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[10] +
                    dStack_380 *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[6] +
                    local_3a8[2] *
                    local_328.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[2];
        dStack_1e0 = dStack_350 *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xf] +
                     dStack_368 *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[0xb] +
                     dStack_380 *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[7] +
                     local_3a8[2] *
                     local_328.
                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array[3];
        local_260.m_lhs.m_lhs.m_lhs = (LhsNested)&local_328;
        local_260.m_lhs.m_lhs.m_rhs = (RhsNested)local_3a8;
        local_260.m_lhs.m_rhs.m_matrix = (non_const_type)local_78;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_1d8,(SrcXprType *)&local_260.m_lhs.m_rhs,&local_445);
        pMStack_190 = (RhsNested)local_238;
        dVar24 = local_1f8 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] +
                 (double)local_238._32_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] +
                 (double)local_238._0_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0];
        dVar25 = dStack_1f0 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] +
                 dStack_210 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] +
                 (double)local_238._8_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0];
        dVar1 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] * local_1e8 +
                local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] * local_208 +
                local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0] * (double)local_238._16_8_;
        dVar2 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] * dStack_1e0 +
                local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] * dStack_200 +
                local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0] * (double)local_238._24_8_;
        dVar28 = local_1f8 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] +
                 (double)local_238._32_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] +
                 (double)local_238._0_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3];
        dVar29 = dStack_1f0 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] +
                 dStack_210 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] +
                 (double)local_238._8_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3];
        dVar26 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] * local_1e8 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] * local_208 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] * (double)local_238._16_8_;
        dVar27 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] * dStack_1e0 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] * dStack_200 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] * (double)local_238._24_8_;
        dVar22 = local_1f8 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] +
                 (double)local_238._32_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] +
                 (double)local_238._0_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
        dVar23 = dStack_1f0 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] +
                 dStack_210 *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] +
                 (double)local_238._8_8_ *
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
        dVar30 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] * local_1e8 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] * local_208 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] * (double)local_238._16_8_;
        dVar31 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] * dStack_1e0 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] * dStack_200 +
                 local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] * (double)local_238._24_8_;
        local_288 = dVar22 * local_338 +
                    dVar28 * (double)local_348._8_8_ + dVar24 * (double)local_348._0_8_ + local_288;
        dStack_280 = dVar23 * local_338 +
                     dVar29 * (double)local_348._8_8_ + dVar25 * (double)local_348._0_8_ +
                     dStack_280;
        local_278 = local_338 * dVar30 +
                    (double)local_348._8_8_ * dVar26 + (double)local_348._0_8_ * dVar1 + local_278;
        dStack_270 = local_338 * dVar31 +
                     (double)local_348._8_8_ * dVar27 + (double)local_348._0_8_ * dVar2 + dStack_270
        ;
        (local_440->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[0] = local_288;
        (local_440->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[1] = dStack_280;
        (local_440->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[2] = local_278;
        (local_440->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
        array[3] = dStack_270;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.k_ = local_444;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.v_.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
             local_288;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.v_.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
             dStack_280;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.v_.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
             local_278;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.v_.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
             dStack_270;
        (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.isSet_ = true;
        auVar10._8_4_ = SUB84(dVar2,0);
        auVar10._0_8_ = dVar1;
        auVar10._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_438._8_8_ = auVar10._8_8_;
        lVar13 = 0;
        do {
          dVar3 = *(double *)
                   ((long)local_328.
                          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar13);
          dVar4 = *(double *)
                   ((long)local_328.
                          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar13 + 8);
          dVar5 = *(double *)
                   ((long)local_328.
                          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar13 + 0x10);
          dVar6 = *(double *)
                   ((long)local_328.
                          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar13 + 0x18);
          *(double *)(local_238 + lVar13) =
               (0.0 - (dVar22 * dStack_350 + dVar28 * dStack_358 + dVar24 * local_360)) * dVar6 +
               (0.0 - (dVar22 * dStack_368 + dVar28 * dStack_370 + dVar24 * local_378)) * dVar5 +
               (0.0 - (dVar22 * dStack_380 + dVar28 * dStack_388 + dVar24 * local_3a8[3])) * dVar4 +
               (1.0 - (dVar22 * local_3a8[2] + dVar28 * local_3a8[1] + dVar24 * local_3a8[0])) *
               dVar3;
          *(double *)(local_238 + lVar13 + 8) =
               (0.0 - (dVar23 * dStack_350 + dVar29 * dStack_358 + dVar25 * local_360)) * dVar6 +
               (0.0 - (dVar23 * dStack_368 + dVar29 * dStack_370 + dVar25 * local_378)) * dVar5 +
               (1.0 - (dVar23 * dStack_380 + dVar29 * dStack_388 + dVar25 * local_3a8[3])) * dVar4 +
               (0.0 - (dVar23 * local_3a8[2] + dVar29 * local_3a8[1] + dVar25 * local_3a8[0])) *
               dVar3;
          *(double *)(local_238 + lVar13 + 0x10) =
               dVar6 * (0.0 - (dStack_350 * dVar30 + dStack_358 * dVar26 + local_360 * dVar1)) +
               dVar5 * (1.0 - (dStack_368 * dVar30 + dStack_370 * dVar26 + local_378 * dVar1)) +
               dVar4 * (0.0 - (dStack_380 * dVar30 + dStack_388 * dVar26 + local_3a8[3] * dVar1)) +
               dVar3 * (0.0 - (local_3a8[2] * dVar30 + local_3a8[1] * dVar26 + local_3a8[0] * dVar1)
                       );
          *(double *)(local_238 + lVar13 + 0x18) =
               dVar6 * (1.0 - (dStack_350 * dVar31 +
                              dStack_358 * dVar27 + local_360 * (double)local_438._8_8_)) +
               dVar5 * (0.0 - (dStack_368 * dVar31 +
                              dStack_370 * dVar27 + local_378 * (double)local_438._8_8_)) +
               dVar4 * (0.0 - (dStack_380 * dVar31 + dStack_388 * dVar27 + local_3a8[3] * dVar2)) +
               dVar3 * (0.0 - (local_3a8[2] * dVar31 + local_3a8[1] * dVar27 + local_3a8[0] * dVar2)
                       );
          lVar13 = lVar13 + 0x20;
        } while (lVar13 != 0x80);
        (this->p_).k_ = local_444;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_238._0_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)local_238._8_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = (double)local_238._16_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = (double)local_238._24_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)local_238._32_8_;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = dStack_210;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = local_208;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = dStack_200;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = local_1f8;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = dStack_1f0;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = local_1e8;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = dStack_1e0;
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0];
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[2];
        (this->p_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[3];
        (this->p_).isSet_ = true;
        return local_440;
      }
      __function = 
      "void stateObservation::compileTime::IndexedMatrix<3, 3>::check_() const [r = 3, c = 3]";
      goto LAB_00115c4c;
    }
  }
  __function = 
  "void stateObservation::compileTime::IndexedMatrix<3, 1>::check_() const [r = 3, c = 1]";
LAB_00115c4c:
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,__function);
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilterBase<n,m,p>::oneStepEstimation_()
{
    unsigned k=this->x_.getTime();
    BOOST_ASSERT(this->y_.size()> 0 && this->y_[0].getTime()==k+1 && "ERROR: The measurement vector is not set");
    if (p>0)
        BOOST_ASSERT(this->u_.size()> 0 && this->u_[0].getTime()==k && "ERROR: The input vector is not set");

    BOOST_ASSERT(a_.isSet() && "ERROR: The Matrix A is not initialized" );
    BOOST_ASSERT(c_.isSet() && "ERROR: The Matrix C is not initialized");
    BOOST_ASSERT(q_.isSet() && "ERROR: The Matrix Q is not initialized");
    BOOST_ASSERT(r_.isSet() && "ERROR: The Matrix R is not initialized");
    BOOST_ASSERT(p_.isSet() && "ERROR: The Matrix P is not initialized");

    Amatrix a=a_();
    Cmatrix c=c_();
    Pmatrix px=p_();

    //prediction
    typename ObserverBase<n,m,p>::StateVector xbar=prediction_(k+1);
    Pmatrix pbar=a*px*a.transpose()+q_();

    //innovation
    typename ObserverBase<n,m,p>::MeasureVector ino= this->y_[0]() - simulateSensor_(xbar,k+1);
    Rmatrix inoCov = c * pbar * c.transpose() + r_();

    //gain
    Kmatrix kGain ((pbar * c.transpose()) * inoCov.inverse());

    //update
    typename ObserverBase<n,m,p>::StateVector xhat=xbar+kGain*ino;

    this->x_.set(xhat,k+1);
    p_.set((Pmatrix::Identity()-kGain*c)*pbar,k+1);

    return xhat;
}